

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O2

void CreateBackwardReferencesDH42
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  BrotliEncoderDictionary *pBVar9;
  void *pvVar10;
  void *pvVar11;
  HasherCommon *pHVar12;
  PreparedDictionary *pPVar13;
  uint8_t *puVar14;
  BrotliDictionary *pBVar15;
  size_t sVar16;
  undefined8 uVar17;
  int iVar18;
  byte bVar19;
  uint32_t *addr;
  undefined8 *puVar20;
  ulong uVar21;
  byte bVar22;
  ushort uVar23;
  uint uVar24;
  ulong uVar25;
  ulong *puVar26;
  char *pcVar27;
  ulong uVar28;
  uint32_t uVar29;
  uint uVar30;
  int iVar31;
  uint *puVar32;
  ulong uVar33;
  int iVar34;
  ulong uVar35;
  ulong uVar36;
  ulong *puVar37;
  ulong uVar38;
  byte bVar39;
  uint16_t uVar40;
  ulong uVar41;
  ulong *puVar42;
  uint uVar43;
  ulong uVar44;
  uint uVar45;
  ulong uVar46;
  long lVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  uint8_t *s1_orig;
  size_t sVar52;
  long lVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  long lVar58;
  int last_distance;
  ulong uVar59;
  size_t sVar60;
  size_t sVar61;
  bool bVar62;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  ulong local_178;
  size_t local_168;
  ulong local_160;
  ulong local_148;
  ulong local_138;
  ulong local_128;
  ulong local_110;
  ulong local_108;
  Command *local_100;
  int local_e8;
  uint local_e4;
  ulong local_e0;
  ulong local_c0;
  
  uVar46 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  sVar7 = params->stream_offset;
  uVar5 = (position - 3) + num_bytes;
  sVar52 = position;
  if (3 < num_bytes) {
    sVar52 = uVar5;
  }
  lVar53 = 0x200;
  if (params->quality < 9) {
    lVar53 = 0x40;
  }
  local_168 = *last_insert_len;
  iVar31 = (int)*(undefined8 *)dist_cache;
  iVar34 = (int)((ulong)*(undefined8 *)dist_cache >> 0x20);
  sVar8 = (params->dictionary).compound.total_size;
  dist_cache[4] = iVar31 + -1;
  dist_cache[5] = iVar31 + 1;
  dist_cache[6] = iVar31 + -2;
  dist_cache[7] = iVar31 + 2;
  dist_cache[8] = iVar31 + -3;
  dist_cache[9] = iVar31 + 3;
  dist_cache[10] = iVar34 + -1;
  dist_cache[0xb] = iVar34 + 1;
  dist_cache[0xc] = iVar34 + -2;
  dist_cache[0xd] = iVar34 + 2;
  dist_cache[0xe] = iVar34 + -3;
  dist_cache[0xf] = iVar34 + 3;
  uVar3 = position + num_bytes;
  uVar6 = (position - 4) + num_bytes;
  lVar4 = position - 1;
  uVar54 = lVar53 + position;
  lVar1 = sVar8 + 1;
  local_100 = commands;
LAB_00e06426:
LAB_00e06433:
  uVar21 = position;
  if (uVar3 <= uVar21 + 4) {
    *last_insert_len = (local_168 + uVar3) - uVar21;
    *num_commands = *num_commands + ((long)local_100 - (long)commands >> 4);
    return;
  }
  uVar50 = uVar46;
  if (uVar21 < uVar46) {
    uVar50 = uVar21;
  }
  uVar51 = sVar7 + uVar21;
  if (uVar46 <= sVar7 + uVar21) {
    uVar51 = uVar46;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_e4 = 0;
    local_c0 = 0;
    goto LAB_00e064d8;
  }
  if (uVar21 == 0) {
    local_c0 = 0;
LAB_00e064ac:
    uVar35 = 0;
  }
  else {
    local_c0 = (ulong)ringbuffer[uVar21 - 1 & ringbuffer_mask];
    if (uVar21 == 1) goto LAB_00e064ac;
    uVar35 = (ulong)ringbuffer[uVar21 - 2 & ringbuffer_mask];
  }
  local_e4 = (uint)(params->dictionary).contextual.context_map
                   [literal_context_lut[uVar35 + 0x100] | literal_context_lut[local_c0]];
LAB_00e064d8:
  local_138 = uVar3 - uVar21;
  pBVar9 = (params->dictionary).contextual.dict[local_e4];
  uVar35 = (params->dist).max_distance;
  pvVar10 = (hasher->privat)._H42.extra[0];
  pvVar11 = (hasher->privat)._H42.extra[1];
  uVar41 = uVar21 & ringbuffer_mask;
  puVar42 = (ulong *)(ringbuffer + uVar41);
  uVar24 = (uint)(*(int *)(ringbuffer + uVar41) * 0x1e35a7bd) >> 0x11;
  uVar55 = 0x7e4;
  uVar36 = 0;
  uVar49 = 0;
  lVar47 = 0;
  local_198 = 0;
  do {
    if (lVar47 == 0x10) {
      uVar33 = (ulong)uVar24;
      uVar45 = uVar24 & 0x1ff;
      sVar60 = (hasher->privat)._H42.max_hops;
      uVar57 = uVar21 - *(uint *)((long)pvVar10 + uVar33 * 4);
      uVar23 = *(ushort *)((long)pvVar10 + uVar33 * 2 + 0x20000);
      uVar43 = uVar45 << 0xb;
      uVar56 = 0;
      uVar25 = local_198;
      uVar59 = uVar57;
      do {
        local_198 = uVar55;
        local_160 = uVar49;
        uVar48 = uVar25;
        local_148 = uVar36;
        uVar44 = uVar48 + uVar41;
        do {
          do {
            do {
              do {
                bVar62 = sVar60 == 0;
                sVar60 = sVar60 - 1;
                if ((bVar62) || (uVar56 = uVar56 + uVar59, uVar50 < uVar56)) {
                  uVar23 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar45 * 2);
                  *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar45 * 2) = uVar23 + 1;
                  uVar45 = uVar23 & 0x1ff;
                  *(char *)((long)pvVar10 + (uVar21 & 0xffff) + 0x30000) = (char)uVar24;
                  if (0xfffe < uVar57) {
                    uVar57 = 0xffff;
                  }
                  *(short *)((long)pvVar11 + (ulong)uVar45 * 4 + (ulong)uVar43) = (short)uVar57;
                  *(undefined2 *)((long)pvVar11 + (ulong)uVar45 * 4 + (ulong)uVar43 + 2) =
                       *(undefined2 *)((long)pvVar10 + uVar33 * 2 + 0x20000);
                  *(int *)((long)pvVar10 + uVar33 * 4) = (int)uVar21;
                  *(short *)((long)pvVar10 + uVar33 * 2 + 0x20000) = (short)uVar45;
                  if (local_198 != 0x7e4) {
                    iVar31 = 0;
                    goto LAB_00e06aba;
                  }
                  pHVar12 = (hasher->privat)._H42.common;
                  uVar50 = pHVar12->dict_num_lookups;
                  local_190 = pHVar12->dict_num_matches;
                  local_198 = 0x7e4;
                  if (uVar50 >> 7 <= local_190) {
                    uVar36 = (ulong)((uint)((int)*puVar42 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                    puVar14 = pBVar9->hash_table_lengths;
                    iVar31 = 0;
                    local_198 = 0x7e4;
                    lVar47 = 0;
                    goto LAB_00e06909;
                  }
                  iVar31 = 0;
                  goto LAB_00e06aba;
                }
                uVar36 = (ulong)uVar23;
                uVar23 = *(ushort *)((long)pvVar11 + uVar36 * 4 + (ulong)uVar43 + 2);
                uVar59 = (ulong)*(ushort *)((long)pvVar11 + uVar36 * 4 + (ulong)uVar43);
              } while (ringbuffer_mask < uVar44);
              uVar49 = uVar21 - uVar56 & ringbuffer_mask;
              uVar36 = uVar49 + uVar48;
            } while ((ringbuffer_mask < uVar36) || (ringbuffer[uVar44] != ringbuffer[uVar36]));
            puVar26 = (ulong *)(ringbuffer + uVar49);
            lVar47 = 0;
            uVar36 = local_138;
            puVar37 = puVar42;
LAB_00e06756:
            if (uVar36 < 8) {
              for (uVar25 = 0;
                  (uVar36 != uVar25 &&
                  (*(char *)((long)puVar26 + uVar25) == *(char *)((long)puVar37 + uVar25)));
                  uVar25 = uVar25 + 1) {
              }
            }
            else {
              if (*puVar37 == *puVar26) goto code_r0x00e06767;
              uVar49 = *puVar26 ^ *puVar37;
              uVar36 = 0;
              if (uVar49 != 0) {
                for (; (uVar49 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                }
              }
              uVar25 = uVar36 >> 3 & 0x1fffffff;
            }
            uVar25 = uVar25 - lVar47;
          } while (uVar25 < 4);
          iVar31 = 0x1f;
          if ((uint)uVar56 != 0) {
            for (; (uint)uVar56 >> iVar31 == 0; iVar31 = iVar31 + -1) {
            }
          }
          uVar55 = (ulong)(iVar31 * -0x1e + 0x780) + uVar25 * 0x87;
          uVar36 = uVar56;
          uVar49 = uVar25;
        } while (uVar55 <= local_198);
      } while( true );
    }
    uVar59 = (ulong)dist_cache[lVar47];
    uVar25 = uVar21 - uVar59;
    if ((((lVar47 == 0) || (*(char *)((long)pvVar10 + (uVar25 & 0xffff) + 0x30000) == (char)uVar24))
        && (uVar59 <= uVar50)) && (uVar25 < uVar21)) {
      puVar26 = (ulong *)(ringbuffer + (uVar25 & ringbuffer_mask));
      lVar58 = 0;
      uVar25 = local_138;
      puVar37 = puVar42;
LAB_00e065a6:
      if (uVar25 < 8) {
        for (uVar56 = 0;
            (uVar25 != uVar56 &&
            (*(char *)((long)puVar26 + uVar56) == *(char *)((long)puVar37 + uVar56)));
            uVar56 = uVar56 + 1) {
        }
        uVar56 = uVar56 - lVar58;
      }
      else {
        if (*puVar37 == *puVar26) goto code_r0x00e065b7;
        uVar56 = *puVar26 ^ *puVar37;
        uVar25 = 0;
        if (uVar56 != 0) {
          for (; (uVar56 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
          }
        }
        uVar56 = (uVar25 >> 3 & 0x1fffffff) - lVar58;
      }
      if ((1 < uVar56) && (uVar25 = uVar56 * 0x87 + 0x78f, uVar55 < uVar25)) {
        if (lVar47 != 0) {
          uVar25 = uVar25 - ((0x1ca10U >> ((byte)lVar47 & 0xe) & 0xe) + 0x27);
        }
        if (uVar55 < uVar25) {
          uVar36 = uVar59;
          uVar49 = uVar56;
          uVar55 = uVar25;
          local_198 = uVar56;
        }
      }
    }
    lVar47 = lVar47 + 1;
  } while( true );
LAB_00e06909:
  if (lVar47 == 2) goto LAB_00e06aba;
  uVar50 = uVar50 + 1;
  pHVar12->dict_num_lookups = uVar50;
  bVar22 = puVar14[uVar36];
  uVar49 = (ulong)bVar22;
  if ((uVar49 != 0) && (uVar49 <= local_138)) {
    pBVar15 = pBVar9->words;
    puVar26 = (ulong *)(pBVar15->data +
                       (ulong)pBVar15->offsets_by_length[uVar49] +
                       pBVar9->hash_table_words[uVar36] * uVar49);
    lVar58 = 0;
    puVar37 = puVar42;
    uVar55 = uVar49;
LAB_00e06976:
    if (uVar55 < 8) {
      for (uVar55 = 0;
          ((bVar22 & 7) != uVar55 &&
          (*(char *)((long)puVar37 + uVar55) == *(char *)((long)puVar26 + uVar55)));
          uVar55 = uVar55 + 1) {
      }
    }
    else {
      if (*puVar26 == *puVar37) goto code_r0x00e06988;
      uVar25 = *puVar37 ^ *puVar26;
      uVar55 = 0;
      if (uVar25 != 0) {
        for (; (uVar25 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
        }
      }
      uVar55 = uVar55 >> 3 & 0x1fffffff;
    }
    uVar55 = uVar55 - lVar58;
    if (((uVar55 != 0) && (uVar49 < pBVar9->cutoffTransformsCount + uVar55)) &&
       (uVar49 = (ulong)pBVar9->hash_table_words[uVar36] + uVar51 + lVar1 +
                 ((ulong)((uint)(pBVar9->cutoffTransforms >>
                                ((char)(uVar49 - uVar55) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar49 - uVar55) * 4 << (pBVar15->size_bits_by_length[uVar49] & 0x3f)),
       uVar49 <= uVar35)) {
      iVar34 = 0x1f;
      if ((uint)uVar49 != 0) {
        for (; (uint)uVar49 >> iVar34 == 0; iVar34 = iVar34 + -1) {
        }
      }
      uVar25 = (uVar55 * 0x87 - (ulong)(uint)(iVar34 * 0x1e)) + 0x780;
      if (local_198 <= uVar25) {
        iVar31 = (uint)bVar22 - (int)uVar55;
        local_190 = local_190 + 1;
        pHVar12->dict_num_matches = local_190;
        local_198 = uVar25;
        local_160 = uVar55;
        local_148 = uVar49;
      }
    }
  }
  lVar47 = lVar47 + 1;
  uVar36 = uVar36 + 1;
  goto LAB_00e06909;
LAB_00e06aba:
  local_128 = (params->dist).max_distance;
  sVar60 = 0;
LAB_00e06adc:
  if (sVar60 != (params->dictionary).compound.num_chunks) {
    pPVar13 = (params->dictionary).compound.chunks[sVar60];
    bVar22 = (byte)pPVar13->bucket_bits;
    bVar39 = (byte)pPVar13->slot_bits;
    bVar19 = -(char)pPVar13->hash_bits;
    uVar50 = ((*puVar42 << (bVar19 & 0x3f)) >> (bVar19 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar22 & 0x3f);
    lVar47 = (1L << (bVar39 & 0x3f)) * 4;
    lVar58 = (1L << (bVar22 & 0x3f)) * 2;
    bVar39 = -bVar39;
    uVar24 = (uint)*(ushort *)((long)&pPVar13[1].magic + (uVar50 & 0xffffffff) * 2 + lVar47);
    puVar20 = (undefined8 *)
              ((long)&pPVar13[1].magic + (ulong)pPVar13->num_items * 4 + lVar58 + lVar47);
    if (pPVar13->magic != 0xdebcede0) {
      puVar20 = (undefined8 *)*puVar20;
    }
    uVar35 = (uVar51 + (params->dictionary).compound.total_size) -
             (params->dictionary).compound.chunk_offsets[sVar60];
    uVar36 = (ulong)pPVar13->source_size;
    puVar32 = (uint *)((long)&pPVar13[1].magic +
                      (ulong)(uVar24 + (&pPVar13[1].magic)
                                       [(uint)((int)uVar50 << (bVar39 & 0x1f)) >> (bVar39 & 0x1f)])
                      * 4 + lVar58 + lVar47);
    uVar24 = (uint)(uVar24 == 0xffff);
    lVar47 = 0;
    local_190 = local_198;
    local_1a0 = local_160;
    do {
      if (lVar47 == 4) {
        do {
          do {
            do {
              do {
                if (uVar24 != 0) {
                  sVar60 = sVar60 + 1;
                  goto LAB_00e06adc;
                }
                uVar24 = *puVar32;
                puVar32 = puVar32 + 1;
                uVar49 = (ulong)(uVar24 & 0x7fffffff);
                uVar24 = uVar24 & 0x80000000;
                uVar55 = uVar35 - uVar49;
                uVar50 = uVar36 - uVar49;
                if (local_138 <= uVar36 - uVar49) {
                  uVar50 = local_138;
                }
              } while ((((local_128 < uVar55) || (ringbuffer_mask < uVar41 + local_1a0)) ||
                       (uVar50 <= local_1a0)) ||
                      (ringbuffer[uVar41 + local_1a0] !=
                       *(uint8_t *)((long)puVar20 + local_1a0 + uVar49)));
              lVar47 = (long)puVar20 + uVar49;
              uVar59 = 0;
              lVar58 = 0;
              uVar25 = uVar50;
              puVar37 = puVar42;
LAB_00e06daa:
              if (7 < uVar25) {
                if (*puVar37 == *(ulong *)(lVar47 + uVar59)) goto code_r0x00e06dbd;
                uVar49 = *(ulong *)(lVar47 + uVar59) ^ *puVar37;
                uVar50 = 0;
                if (uVar49 != 0) {
                  for (; (uVar49 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                  }
                }
                uVar50 = (uVar50 >> 3 & 0x1fffffff) - lVar58;
                goto LAB_00e06e19;
              }
              lVar58 = uVar49 + uVar50 + (long)puVar20;
              for (; uVar50 != uVar59; uVar59 = uVar59 + 1) {
                if (*(char *)(lVar47 + uVar59) != *(char *)((long)puVar42 + uVar59)) {
                  lVar58 = uVar59 + lVar47;
                  break;
                }
              }
              uVar50 = lVar58 - lVar47;
LAB_00e06e19:
            } while (uVar50 < 4);
            iVar34 = 0x1f;
            if ((uint)uVar55 != 0) {
              for (; (uint)uVar55 >> iVar34 == 0; iVar34 = iVar34 + -1) {
              }
            }
            uVar49 = (ulong)(iVar34 * -0x1e + 0x780) + uVar50 * 0x87;
          } while (uVar49 <= local_190);
          iVar31 = 0;
          local_1a0 = uVar50;
          local_198 = uVar49;
          local_190 = uVar49;
          local_160 = uVar50;
          local_148 = uVar55;
        } while( true );
      }
      uVar50 = (ulong)dist_cache[lVar47];
      if ((uVar35 - uVar36 < uVar50) && (lVar58 = uVar35 - uVar50, uVar50 <= uVar35)) {
        uVar49 = uVar36 - lVar58;
        if (local_138 <= uVar36 - lVar58) {
          uVar49 = local_138;
        }
        uVar25 = 0;
        uVar55 = uVar49;
LAB_00e06c10:
        if (uVar55 < 8) {
          for (pcVar27 = (char *)((long)puVar20 + uVar25 + lVar58);
              (uVar49 != uVar25 && (*pcVar27 == *(char *)((long)puVar42 + uVar25)));
              pcVar27 = pcVar27 + 1) {
            uVar25 = uVar25 + 1;
          }
        }
        else {
          uVar59 = *(ulong *)((long)puVar20 + uVar25 + lVar58);
          if (*(ulong *)((long)puVar42 + uVar25) == uVar59) goto code_r0x00e06c23;
          uVar59 = uVar59 ^ *(ulong *)((long)puVar42 + uVar25);
          uVar49 = 0;
          if (uVar59 != 0) {
            for (; (uVar59 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
            }
          }
          uVar25 = uVar25 + (uVar49 >> 3 & 0x1fffffff);
        }
        if ((1 < uVar25) && (uVar49 = uVar25 * 0x87 + 0x78f, local_190 < uVar49)) {
          if (lVar47 != 0) {
            uVar49 = uVar49 - ((0x1ca10U >> ((byte)lVar47 & 2) & 4) + 0x27);
          }
          if (local_190 < uVar49) {
            if (local_1a0 < uVar25) {
              local_1a0 = uVar25;
            }
            iVar31 = 0;
            local_198 = uVar49;
            local_160 = uVar25;
            local_148 = uVar50;
            local_190 = uVar49;
          }
        }
      }
      lVar47 = lVar47 + 1;
    } while( true );
  }
  if (local_198 < 0x7e5) {
    local_168 = local_168 + 1;
    position = uVar21 + 1;
    if (uVar54 < position) {
      if (uVar54 + (uint)((int)lVar53 * 4) < position) {
        uVar50 = uVar21 + 0x11;
        if (uVar6 <= uVar21 + 0x11) {
          uVar50 = uVar6;
        }
        for (; position < uVar50; position = position + 4) {
          pvVar10 = (hasher->privat)._H42.extra[0];
          uVar24 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar21 = (ulong)uVar24;
          uVar45 = uVar24 & 0x1ff;
          uVar23 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar45 * 2);
          pvVar11 = (hasher->privat)._H42.extra[1];
          *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar45 * 2) = uVar23 + 1;
          uVar43 = uVar23 & 0x1ff;
          uVar51 = position - *(uint *)((long)pvVar10 + uVar21 * 4);
          *(char *)((long)pvVar10 + (position & 0xffff) + 0x30000) = (char)uVar24;
          if (0xfffe < uVar51) {
            uVar51 = 0xffff;
          }
          *(short *)((long)pvVar11 + (ulong)uVar43 * 4 + (ulong)(uVar45 << 0xb)) = (short)uVar51;
          *(undefined2 *)((long)pvVar11 + (ulong)uVar43 * 4 + (ulong)(uVar45 << 0xb) + 2) =
               *(undefined2 *)((long)pvVar10 + uVar21 * 2 + 0x20000);
          *(int *)((long)pvVar10 + uVar21 * 4) = (int)position;
          *(short *)((long)pvVar10 + uVar21 * 2 + 0x20000) = (short)uVar43;
          local_168 = local_168 + 4;
        }
      }
      else {
        uVar50 = uVar21 + 9;
        if (uVar5 <= uVar21 + 9) {
          uVar50 = uVar5;
        }
        for (; position < uVar50; position = position + 2) {
          pvVar10 = (hasher->privat)._H42.extra[0];
          uVar24 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar21 = (ulong)uVar24;
          uVar45 = uVar24 & 0x1ff;
          uVar23 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar45 * 2);
          pvVar11 = (hasher->privat)._H42.extra[1];
          *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar45 * 2) = uVar23 + 1;
          uVar43 = uVar23 & 0x1ff;
          uVar51 = position - *(uint *)((long)pvVar10 + uVar21 * 4);
          *(char *)((long)pvVar10 + (position & 0xffff) + 0x30000) = (char)uVar24;
          if (0xfffe < uVar51) {
            uVar51 = 0xffff;
          }
          *(short *)((long)pvVar11 + (ulong)uVar43 * 4 + (ulong)(uVar45 << 0xb)) = (short)uVar51;
          *(undefined2 *)((long)pvVar11 + (ulong)uVar43 * 4 + (ulong)(uVar45 << 0xb) + 2) =
               *(undefined2 *)((long)pvVar10 + uVar21 * 2 + 0x20000);
          *(int *)((long)pvVar10 + uVar21 * 4) = (int)position;
          *(short *)((long)pvVar10 + uVar21 * 2 + 0x20000) = (short)uVar43;
          local_168 = local_168 + 2;
        }
      }
    }
    goto LAB_00e06433;
  }
  uVar50 = local_168 + 4;
  uVar54 = sVar7 + 1 + uVar21;
  local_108 = (lVar4 + num_bytes) - uVar21;
  local_e8 = 0;
LAB_00e0708b:
  uVar51 = uVar46;
  if (uVar54 < uVar46) {
    uVar51 = uVar54;
  }
  local_138 = local_138 - 1;
  uVar35 = local_160 - 1;
  if (local_138 <= local_160 - 1) {
    uVar35 = local_138;
  }
  if (4 < params->quality) {
    uVar35 = 0;
  }
  uVar36 = uVar21 + 1;
  uVar49 = uVar46;
  if (uVar36 < uVar46) {
    uVar49 = uVar36;
  }
  local_e0 = sVar7 + uVar21 + 1;
  if (uVar46 <= local_e0) {
    local_e0 = uVar46;
  }
  if ((params->dictionary).contextual.context_based != 0) {
    local_e4 = (uint)(params->dictionary).contextual.context_map
                     [literal_context_lut[local_c0 + 0x100] |
                      literal_context_lut[ringbuffer[uVar21 & ringbuffer_mask]]];
    local_c0 = (ulong)ringbuffer[uVar21 & ringbuffer_mask];
  }
  pBVar9 = (params->dictionary).contextual.dict[local_e4];
  pvVar10 = (hasher->privat)._H42.extra[0];
  pvVar11 = (hasher->privat)._H42.extra[1];
  uVar59 = uVar36 & ringbuffer_mask;
  puVar42 = (ulong *)(ringbuffer + uVar59);
  uVar24 = (uint)(*(int *)(ringbuffer + uVar59) * 0x1e35a7bd) >> 0x11;
  uVar25 = 0x7e4;
  uVar41 = 0;
  uVar55 = 0;
  lVar47 = 0;
  do {
    if (lVar47 == 0x10) {
      uVar44 = (ulong)uVar24;
      uVar45 = uVar24 & 0x1ff;
      sVar60 = (hasher->privat)._H42.max_hops;
      uVar33 = uVar36 - *(uint *)((long)pvVar10 + uVar44 * 4);
      uVar23 = *(ushort *)((long)pvVar10 + uVar44 * 2 + 0x20000);
      uVar43 = uVar45 << 0xb;
      uVar57 = 0;
      uVar56 = uVar33;
      do {
        local_178 = uVar25;
        local_188 = uVar41;
        uVar28 = uVar35;
        uVar38 = uVar55;
        uVar48 = uVar28 + uVar59;
        do {
          do {
            do {
              do {
                bVar62 = sVar60 == 0;
                sVar60 = sVar60 - 1;
                if ((bVar62) || (uVar57 = uVar57 + uVar56, uVar49 < uVar57)) {
                  uVar23 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar45 * 2);
                  *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar45 * 2) = uVar23 + 1;
                  uVar45 = uVar23 & 0x1ff;
                  *(char *)((long)pvVar10 + (uVar36 & 0xffff) + 0x30000) = (char)uVar24;
                  if (0xfffe < uVar33) {
                    uVar33 = 0xffff;
                  }
                  *(short *)((long)pvVar11 + (ulong)uVar45 * 4 + (ulong)uVar43) = (short)uVar33;
                  *(undefined2 *)((long)pvVar11 + (ulong)uVar45 * 4 + (ulong)uVar43 + 2) =
                       *(undefined2 *)((long)pvVar10 + uVar44 * 2 + 0x20000);
                  *(int *)((long)pvVar10 + uVar44 * 4) = (int)uVar36;
                  *(short *)((long)pvVar10 + uVar44 * 2 + 0x20000) = (short)uVar45;
                  iVar34 = 0;
                  if (local_178 != 0x7e4) goto LAB_00e076fd;
                  pHVar12 = (hasher->privat)._H42.common;
                  uVar35 = pHVar12->dict_num_lookups;
                  local_110 = pHVar12->dict_num_matches;
                  local_178 = 0x7e4;
                  if (local_110 < uVar35 >> 7) goto LAB_00e076fd;
                  uVar49 = (ulong)((uint)((int)*puVar42 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                  puVar14 = pBVar9->hash_table_lengths;
                  local_178 = 0x7e4;
                  iVar34 = 0;
                  lVar47 = 0;
                  goto LAB_00e0756b;
                }
                uVar35 = (ulong)uVar23;
                uVar23 = *(ushort *)((long)pvVar11 + uVar35 * 4 + (ulong)uVar43 + 2);
                uVar56 = (ulong)*(ushort *)((long)pvVar11 + uVar35 * 4 + (ulong)uVar43);
              } while (ringbuffer_mask < uVar48);
              uVar55 = uVar36 - uVar57 & ringbuffer_mask;
              uVar35 = uVar55 + uVar28;
            } while ((ringbuffer_mask < uVar35) || (ringbuffer[uVar48] != ringbuffer[uVar35]));
            puVar26 = (ulong *)(ringbuffer + uVar55);
            lVar47 = 0;
            puVar37 = puVar42;
            uVar35 = local_138;
LAB_00e073ad:
            if (uVar35 < 8) {
              for (uVar55 = 0;
                  (uVar35 != uVar55 &&
                  (*(char *)((long)puVar26 + uVar55) == *(char *)((long)puVar37 + uVar55)));
                  uVar55 = uVar55 + 1) {
              }
            }
            else {
              if (*puVar37 == *puVar26) goto code_r0x00e073bf;
              uVar55 = *puVar26 ^ *puVar37;
              uVar35 = 0;
              if (uVar55 != 0) {
                for (; (uVar55 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              uVar55 = uVar35 >> 3 & 0x1fffffff;
            }
            uVar55 = uVar55 - lVar47;
          } while (uVar55 < 4);
          iVar34 = 0x1f;
          if ((uint)uVar57 != 0) {
            for (; (uint)uVar57 >> iVar34 == 0; iVar34 = iVar34 + -1) {
            }
          }
          uVar25 = (ulong)(iVar34 * -0x1e + 0x780) + uVar55 * 0x87;
          uVar35 = uVar55;
          uVar41 = uVar57;
        } while (uVar25 <= local_178);
      } while( true );
    }
    uVar33 = (ulong)dist_cache[lVar47];
    uVar56 = uVar36 - uVar33;
    if ((((lVar47 == 0) || (*(char *)((long)pvVar10 + (uVar56 & 0xffff) + 0x30000) == (char)uVar24))
        && (uVar33 <= uVar49)) && (uVar56 < uVar36)) {
      puVar26 = (ulong *)(ringbuffer + (uVar56 & ringbuffer_mask));
      lVar58 = 0;
      puVar37 = puVar42;
      uVar56 = local_138;
LAB_00e07204:
      if (uVar56 < 8) {
        for (uVar57 = 0;
            (uVar56 != uVar57 &&
            (*(char *)((long)puVar26 + uVar57) == *(char *)((long)puVar37 + uVar57)));
            uVar57 = uVar57 + 1) {
        }
      }
      else {
        if (*puVar37 == *puVar26) goto code_r0x00e07216;
        uVar57 = *puVar26 ^ *puVar37;
        uVar56 = 0;
        if (uVar57 != 0) {
          for (; (uVar57 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
          }
        }
        uVar57 = uVar56 >> 3 & 0x1fffffff;
      }
      uVar57 = uVar57 - lVar58;
      if ((1 < uVar57) && (uVar56 = uVar57 * 0x87 + 0x78f, uVar25 < uVar56)) {
        if (lVar47 != 0) {
          uVar56 = uVar56 - ((0x1ca10U >> ((byte)lVar47 & 0xe) & 0xe) + 0x27);
        }
        if (uVar25 < uVar56) {
          uVar55 = uVar57;
          uVar35 = uVar57;
          uVar41 = uVar33;
          uVar25 = uVar56;
        }
      }
    }
    lVar47 = lVar47 + 1;
  } while( true );
code_r0x00e06dbd:
  puVar37 = puVar37 + 1;
  uVar25 = uVar25 - 8;
  lVar58 = lVar58 + -8;
  uVar59 = uVar59 + 8;
  goto LAB_00e06daa;
code_r0x00e06c23:
  uVar55 = uVar55 - 8;
  uVar25 = uVar25 + 8;
  goto LAB_00e06c10;
LAB_00e0756b:
  if (lVar47 == 2) goto LAB_00e076fd;
  uVar35 = uVar35 + 1;
  pHVar12->dict_num_lookups = uVar35;
  bVar22 = puVar14[uVar49];
  uVar55 = (ulong)bVar22;
  if ((uVar55 != 0) && (uVar55 <= local_138)) {
    pBVar15 = pBVar9->words;
    puVar26 = (ulong *)(pBVar15->data +
                       (ulong)pBVar15->offsets_by_length[uVar55] +
                       pBVar9->hash_table_words[uVar49] * uVar55);
    lVar58 = 0;
    puVar37 = puVar42;
    uVar41 = uVar55;
LAB_00e075dc:
    if (uVar41 < 8) {
      for (uVar41 = 0;
          ((bVar22 & 7) != uVar41 &&
          (*(char *)((long)puVar37 + uVar41) == *(char *)((long)puVar26 + uVar41)));
          uVar41 = uVar41 + 1) {
      }
    }
    else {
      if (*puVar26 == *puVar37) goto code_r0x00e075ee;
      uVar25 = *puVar37 ^ *puVar26;
      uVar41 = 0;
      if (uVar25 != 0) {
        for (; (uVar25 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
        }
      }
      uVar41 = uVar41 >> 3 & 0x1fffffff;
    }
    uVar41 = uVar41 - lVar58;
    if (((uVar41 != 0) && (uVar55 < pBVar9->cutoffTransformsCount + uVar41)) &&
       (uVar55 = (ulong)pBVar9->hash_table_words[uVar49] + lVar1 + local_e0 +
                 ((ulong)((uint)(pBVar9->cutoffTransforms >>
                                ((char)(uVar55 - uVar41) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar55 - uVar41) * 4 << (pBVar15->size_bits_by_length[uVar55] & 0x3f)),
       uVar55 <= local_128)) {
      iVar18 = 0x1f;
      if ((uint)uVar55 != 0) {
        for (; (uint)uVar55 >> iVar18 == 0; iVar18 = iVar18 + -1) {
        }
      }
      uVar25 = (uVar41 * 0x87 - (ulong)(uint)(iVar18 * 0x1e)) + 0x780;
      if (local_178 <= uVar25) {
        iVar34 = (uint)bVar22 - (int)uVar41;
        local_110 = local_110 + 1;
        pHVar12->dict_num_matches = local_110;
        local_178 = uVar25;
        uVar38 = uVar41;
        local_188 = uVar55;
      }
    }
  }
  lVar47 = lVar47 + 1;
  uVar49 = uVar49 + 1;
  goto LAB_00e0756b;
LAB_00e076fd:
  local_128 = (params->dist).max_distance;
  sVar60 = (params->dictionary).compound.total_size;
  lVar47 = uVar51 + sVar60;
  sVar61 = 0;
LAB_00e0773e:
  if (sVar61 != (params->dictionary).compound.num_chunks) {
    pPVar13 = (params->dictionary).compound.chunks[sVar61];
    bVar22 = (byte)pPVar13->bucket_bits;
    bVar39 = (byte)pPVar13->slot_bits;
    bVar19 = -(char)pPVar13->hash_bits;
    uVar51 = ((*puVar42 << (bVar19 & 0x3f)) >> (bVar19 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar22 & 0x3f);
    lVar58 = (1L << (bVar39 & 0x3f)) * 4;
    lVar2 = (1L << (bVar22 & 0x3f)) * 2;
    bVar39 = -bVar39;
    uVar24 = (uint)*(ushort *)((long)&pPVar13[1].magic + (uVar51 & 0xffffffff) * 2 + lVar58);
    puVar20 = (undefined8 *)
              ((long)&pPVar13[1].magic + (ulong)pPVar13->num_items * 4 + lVar2 + lVar58);
    if (pPVar13->magic != 0xdebcede0) {
      puVar20 = (undefined8 *)*puVar20;
    }
    sVar16 = (params->dictionary).compound.chunk_offsets[sVar61];
    uVar35 = (local_e0 + sVar60) - sVar16;
    uVar49 = (ulong)pPVar13->source_size;
    puVar32 = (uint *)((long)&pPVar13[1].magic +
                      (ulong)(uVar24 + (&pPVar13[1].magic)
                                       [(uint)((int)uVar51 << (bVar39 & 0x1f)) >> (bVar39 & 0x1f)])
                      * 4 + lVar2 + lVar58);
    uVar24 = (uint)(uVar24 == 0xffff);
    lVar58 = 0;
    local_190 = local_178;
    local_1a0 = uVar38;
    do {
      if (lVar58 == 4) {
        do {
          do {
            do {
              do {
                if (uVar24 != 0) {
                  sVar61 = sVar61 + 1;
                  goto LAB_00e0773e;
                }
                uVar24 = *puVar32;
                puVar32 = puVar32 + 1;
                uVar41 = (ulong)(uVar24 & 0x7fffffff);
                uVar24 = uVar24 & 0x80000000;
                uVar55 = uVar35 - uVar41;
                uVar51 = uVar49 - uVar41;
                if (local_138 <= uVar49 - uVar41) {
                  uVar51 = local_138;
                }
              } while ((((local_128 < uVar55) || (ringbuffer_mask < uVar59 + local_1a0)) ||
                       (uVar51 <= local_1a0)) ||
                      (ringbuffer[uVar59 + local_1a0] !=
                       *(uint8_t *)((long)puVar20 + local_1a0 + uVar41)));
              puVar26 = (ulong *)(uVar41 + (long)puVar20);
              lVar58 = 0;
              puVar37 = puVar42;
LAB_00e07a04:
              if (uVar51 < 8) {
                for (uVar41 = 0;
                    (uVar51 != uVar41 &&
                    (*(char *)((long)puVar26 + uVar41) == *(char *)((long)puVar37 + uVar41)));
                    uVar41 = uVar41 + 1) {
                }
              }
              else {
                if (*puVar37 == *puVar26) goto code_r0x00e07a16;
                uVar41 = *puVar26 ^ *puVar37;
                uVar51 = 0;
                if (uVar41 != 0) {
                  for (; (uVar41 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                  }
                }
                uVar41 = uVar51 >> 3 & 0x1fffffff;
              }
              uVar41 = uVar41 - lVar58;
            } while (uVar41 < 4);
            iVar18 = 0x1f;
            if ((uint)uVar55 != 0) {
              for (; (uint)uVar55 >> iVar18 == 0; iVar18 = iVar18 + -1) {
              }
            }
            uVar51 = (ulong)(iVar18 * -0x1e + 0x780) + uVar41 * 0x87;
          } while (uVar51 <= local_190);
          iVar34 = 0;
          local_178 = uVar51;
          uVar38 = uVar41;
          local_1a0 = uVar41;
          local_190 = uVar51;
          local_188 = uVar55;
        } while( true );
      }
      uVar51 = (ulong)dist_cache[lVar58];
      if ((uVar35 - uVar49 < uVar51) && (uVar51 <= uVar35)) {
        uVar55 = (uVar51 - uVar35) + uVar49;
        if (local_138 <= uVar55) {
          uVar55 = local_138;
        }
        lVar2 = (lVar47 - sVar16) - uVar51;
        uVar41 = 0;
LAB_00e07888:
        if (uVar55 < 8) {
          pcVar27 = (char *)((long)puVar20 + uVar41 + lVar2);
          uVar55 = (sVar16 - lVar47) + uVar49 + uVar51;
          if (local_108 < uVar55) {
            uVar55 = local_108;
          }
          for (; (uVar55 != uVar41 && (*pcVar27 == *(char *)((long)puVar42 + uVar41)));
              pcVar27 = pcVar27 + 1) {
            uVar41 = uVar41 + 1;
          }
        }
        else {
          uVar25 = *(ulong *)((long)puVar20 + uVar41 + lVar2);
          if (*(ulong *)((long)puVar42 + uVar41) == uVar25) goto code_r0x00e0789b;
          uVar25 = uVar25 ^ *(ulong *)((long)puVar42 + uVar41);
          uVar55 = 0;
          if (uVar25 != 0) {
            for (; (uVar25 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
            }
          }
          uVar41 = uVar41 + (uVar55 >> 3 & 0x1fffffff);
        }
        if ((1 < uVar41) && (uVar55 = uVar41 * 0x87 + 0x78f, local_190 < uVar55)) {
          if (lVar58 != 0) {
            uVar55 = uVar55 - ((0x1ca10U >> ((byte)lVar58 & 2) & 4) + 0x27);
          }
          if (local_190 < uVar55) {
            if (local_1a0 < uVar41) {
              local_1a0 = uVar41;
            }
            iVar34 = 0;
            uVar38 = uVar41;
            local_178 = uVar55;
            local_188 = uVar51;
            local_190 = uVar55;
          }
        }
      }
      lVar58 = lVar58 + 1;
    } while( true );
  }
  if (local_178 < local_198 + 0xaf) {
    uVar38 = local_160;
    uVar36 = uVar21;
    local_188 = local_148;
    iVar34 = iVar31;
    sVar60 = local_168;
    local_e0 = uVar21 + sVar7;
    if (uVar46 <= uVar21 + sVar7) {
      local_e0 = uVar46;
    }
    goto LAB_00e07b93;
  }
  sVar60 = uVar50;
  if (local_e8 == 3) goto LAB_00e07b93;
  local_168 = local_168 + 1;
  local_e8 = local_e8 + 1;
  uVar51 = uVar21 + 5;
  uVar54 = uVar54 + 1;
  local_108 = local_108 - 1;
  local_198 = local_178;
  uVar21 = uVar36;
  local_148 = local_188;
  local_160 = uVar38;
  sVar60 = local_168;
  iVar31 = iVar34;
  if (uVar3 <= uVar51) goto LAB_00e07b93;
  goto LAB_00e0708b;
code_r0x00e07a16:
  puVar37 = puVar37 + 1;
  puVar26 = puVar26 + 1;
  uVar51 = uVar51 - 8;
  lVar58 = lVar58 + -8;
  goto LAB_00e07a04;
code_r0x00e0789b:
  uVar55 = uVar55 - 8;
  uVar41 = uVar41 + 8;
  goto LAB_00e07888;
LAB_00e07b93:
  local_168 = sVar60;
  local_e0 = local_e0 + sVar8;
  if (local_e0 < local_188) {
LAB_00e07bab:
    uVar54 = local_188 + 0xf;
  }
  else {
    if (local_188 == (long)*dist_cache) {
      uVar54 = 0;
      goto LAB_00e07c28;
    }
    uVar54 = 1;
    if (local_188 != (long)dist_cache[1]) {
      uVar54 = (local_188 + 3) - (long)*dist_cache;
      if (uVar54 < 7) {
        bVar22 = (byte)((int)uVar54 << 2);
        uVar24 = 0x9750468;
      }
      else {
        uVar54 = (local_188 + 3) - (long)dist_cache[1];
        if (6 < uVar54) {
          uVar54 = 2;
          if ((local_188 != (long)dist_cache[2]) && (uVar54 = 3, local_188 != (long)dist_cache[3]))
          goto LAB_00e07bab;
          goto LAB_00e07baf;
        }
        bVar22 = (byte)((int)uVar54 << 2);
        uVar24 = 0xfdb1ace;
      }
      uVar54 = (ulong)(uVar24 >> (bVar22 & 0x1f) & 0xf);
    }
  }
LAB_00e07baf:
  if ((local_188 <= local_e0) && (uVar54 != 0)) {
    dist_cache[3] = dist_cache[2];
    uVar17 = *(undefined8 *)dist_cache;
    *(undefined8 *)(dist_cache + 1) = uVar17;
    iVar31 = (int)local_188;
    *dist_cache = iVar31;
    dist_cache[4] = iVar31 + -1;
    dist_cache[5] = iVar31 + 1;
    dist_cache[6] = iVar31 + -2;
    dist_cache[7] = iVar31 + 2;
    dist_cache[8] = iVar31 + -3;
    dist_cache[9] = iVar31 + 3;
    iVar31 = (int)uVar17;
    dist_cache[10] = iVar31 + -1;
    dist_cache[0xb] = iVar31 + 1;
    dist_cache[0xc] = iVar31 + -2;
    dist_cache[0xd] = iVar31 + 2;
    *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar31 + 3,iVar31 + -3);
  }
LAB_00e07c28:
  uVar24 = (uint)local_168;
  local_100->insert_len_ = uVar24;
  local_100->copy_len_ = iVar34 << 0x19 | (uint)uVar38;
  uVar50 = (ulong)(params->dist).num_direct_distance_codes;
  uVar21 = uVar50 + 0x10;
  uVar29 = 0;
  if (uVar21 <= uVar54) {
    uVar43 = (params->dist).distance_postfix_bits;
    bVar22 = (byte)uVar43;
    uVar50 = ((4L << (bVar22 & 0x3f)) + (uVar54 - uVar50)) - 0x10;
    uVar45 = 0x1f;
    uVar30 = (uint)uVar50;
    if (uVar30 != 0) {
      for (; uVar30 >> uVar45 == 0; uVar45 = uVar45 - 1) {
      }
    }
    uVar45 = (uVar45 ^ 0xffffffe0) + 0x1f;
    uVar51 = (ulong)((uVar50 >> ((ulong)uVar45 & 0x3f) & 1) != 0);
    lVar47 = (ulong)uVar45 - (ulong)uVar43;
    uVar54 = (~(-1 << (bVar22 & 0x1f)) & uVar30) + uVar21 +
             (uVar51 + lVar47 * 2 + 0xfffe << (bVar22 & 0x3f)) | lVar47 * 0x400;
    uVar29 = (uint32_t)(uVar50 - (uVar51 + 2 << ((byte)uVar45 & 0x3f)) >> (bVar22 & 0x3f));
  }
  local_100->dist_prefix_ = (uint16_t)uVar54;
  local_100->dist_extra_ = uVar29;
  if (5 < local_168) {
    if (local_168 < 0x82) {
      uVar24 = 0x1f;
      uVar43 = (uint)(local_168 - 2);
      if (uVar43 != 0) {
        for (; uVar43 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      uVar24 = (int)(local_168 - 2 >> ((char)(uVar24 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar24 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_168 < 0x842) {
      uVar43 = 0x1f;
      if (uVar24 - 0x42 != 0) {
        for (; uVar24 - 0x42 >> uVar43 == 0; uVar43 = uVar43 - 1) {
        }
      }
      uVar24 = (uVar43 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar24 = 0x15;
      if (0x1841 < local_168) {
        uVar24 = (uint)(ushort)(0x17 - (local_168 < 0x5842));
      }
    }
  }
  uVar43 = iVar34 + (uint)uVar38;
  if (uVar43 < 10) {
    uVar45 = uVar43 - 2;
  }
  else if (uVar43 < 0x86) {
    uVar43 = uVar43 - 6;
    uVar45 = 0x1f;
    if (uVar43 != 0) {
      for (; uVar43 >> uVar45 == 0; uVar45 = uVar45 - 1) {
      }
    }
    uVar45 = (uVar43 >> ((char)(uVar45 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar45 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar45 = 0x17;
    if (uVar43 < 0x846) {
      uVar45 = 0x1f;
      if (uVar43 - 0x46 != 0) {
        for (; uVar43 - 0x46 >> uVar45 == 0; uVar45 = uVar45 - 1) {
        }
      }
      uVar45 = (uVar45 ^ 0xffe0) + 0x2c;
    }
  }
  uVar23 = (ushort)uVar45;
  uVar40 = (uVar23 & 7) + ((ushort)uVar24 & 7) * 8;
  if ((((uVar54 & 0x3ff) == 0) && ((ushort)uVar24 < 8)) && (uVar23 < 0x10)) {
    if (7 < uVar23) {
      uVar40 = uVar40 + 0x40;
    }
  }
  else {
    iVar31 = ((uVar24 & 0xffff) >> 3) * 3 + ((uVar45 & 0xffff) >> 3);
    uVar40 = uVar40 + ((ushort)(0x520d40 >> ((char)iVar31 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar31 * 0x40 + 0x40;
  }
  local_100->cmd_prefix_ = uVar40;
  *num_literals = *num_literals + local_168;
  position = uVar36 + uVar38;
  uVar21 = sVar52;
  if (position < sVar52) {
    uVar21 = position;
  }
  uVar50 = uVar36 + 2;
  if (local_188 < uVar38 >> 2) {
    uVar54 = position + local_188 * -4;
    if (uVar54 < uVar50) {
      uVar54 = uVar50;
    }
    uVar50 = uVar54;
    if (uVar21 < uVar54) {
      uVar50 = uVar21;
    }
  }
  uVar54 = uVar36 + lVar53 + uVar38 * 2;
  local_100 = local_100 + 1;
  for (; uVar50 < uVar21; uVar50 = uVar50 + 1) {
    pvVar10 = (hasher->privat)._H42.extra[0];
    uVar24 = (uint)(*(int *)(ringbuffer + (uVar50 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
    uVar51 = (ulong)uVar24;
    uVar45 = uVar24 & 0x1ff;
    uVar23 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar45 * 2);
    pvVar11 = (hasher->privat)._H42.extra[1];
    *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar45 * 2) = uVar23 + 1;
    uVar43 = uVar23 & 0x1ff;
    uVar35 = uVar50 - *(uint *)((long)pvVar10 + uVar51 * 4);
    if (0xfffe < uVar35) {
      uVar35 = 0xffff;
    }
    *(char *)((long)pvVar10 + (uVar50 & 0xffff) + 0x30000) = (char)uVar24;
    *(short *)((long)pvVar11 + (ulong)uVar43 * 4 + (ulong)(uVar45 << 0xb)) = (short)uVar35;
    *(undefined2 *)((long)pvVar11 + (ulong)uVar43 * 4 + (ulong)(uVar45 << 0xb) + 2) =
         *(undefined2 *)((long)pvVar10 + uVar51 * 2 + 0x20000);
    *(int *)((long)pvVar10 + uVar51 * 4) = (int)uVar50;
    *(short *)((long)pvVar10 + uVar51 * 2 + 0x20000) = (short)uVar43;
  }
  local_168 = 0;
  goto LAB_00e06426;
code_r0x00e075ee:
  puVar26 = puVar26 + 1;
  puVar37 = puVar37 + 1;
  uVar41 = uVar41 - 8;
  lVar58 = lVar58 + -8;
  goto LAB_00e075dc;
code_r0x00e073bf:
  puVar37 = puVar37 + 1;
  puVar26 = puVar26 + 1;
  uVar35 = uVar35 - 8;
  lVar47 = lVar47 + -8;
  goto LAB_00e073ad;
code_r0x00e07216:
  puVar37 = puVar37 + 1;
  puVar26 = puVar26 + 1;
  uVar56 = uVar56 - 8;
  lVar58 = lVar58 + -8;
  goto LAB_00e07204;
code_r0x00e06988:
  puVar26 = puVar26 + 1;
  puVar37 = puVar37 + 1;
  uVar55 = uVar55 - 8;
  lVar58 = lVar58 + -8;
  goto LAB_00e06976;
code_r0x00e06767:
  puVar37 = puVar37 + 1;
  puVar26 = puVar26 + 1;
  uVar36 = uVar36 - 8;
  lVar47 = lVar47 + -8;
  goto LAB_00e06756;
code_r0x00e065b7:
  puVar37 = puVar37 + 1;
  puVar26 = puVar26 + 1;
  uVar25 = uVar25 - 8;
  lVar58 = lVar58 + -8;
  goto LAB_00e065a6;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}